

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

void __thiscall lzham::task_pool::task_pool(task_pool *this,uint num_threads)

{
  uint uVar1;
  uint in_ESI;
  task_pool *in_RDI;
  bool status;
  uint in_stack_000001b4;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  char *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  task_pool *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = in_RDI;
  tsstack<lzham::task_pool::task,_16U>::tsstack
            ((tsstack<lzham::task_pool::task,_16U> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  this_00->m_num_threads = 0;
  semaphore::semaphore
            ((semaphore *)this_00,(long)in_RDI,
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  in_RDI->m_num_outstanding_tasks = 0;
  in_RDI->m_exit_flag = 0;
  utils::zero_object<unsigned_long[16]>((unsigned_long (*) [16])0x11bbc9);
  uVar1 = init(in_RDI,(EVP_PKEY_CTX *)(ulong)in_ESI);
  if ((uVar1 & 1) == 0) {
    lzham_assert(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  }
  return;
}

Assistant:

task_pool::task_pool(uint num_threads) :
      m_num_threads(0),
      m_tasks_available(0, 32767),
      m_num_outstanding_tasks(0),
      m_exit_flag(false)
   {
      utils::zero_object(m_threads);

      bool status = init(num_threads);
      LZHAM_VERIFY(status);
   }